

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

void __thiscall BVSparse<Memory::JitArenaAllocator>::Dump(BVSparse<Memory::JitArenaAllocator> *this)

{
  bool hasBits;
  Type_conflict pBVar1;
  
  Output::Print(L"[ ");
  pBVar1 = this->head;
  if (pBVar1 != (Type_conflict)0x0) {
    hasBits = false;
    do {
      hasBits = BVUnitT<unsigned_long>::Dump(&pBVar1->data,pBVar1->startIndex,hasBits);
      pBVar1 = pBVar1->next;
    } while (pBVar1 != (Type)0x0);
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void
BVSparse<TAllocator>::Dump() const
{
    bool hasBits = false;
    Output::Print(_u("[ "));
    for(BVSparseNode * node = this->head; node != 0 ; node = node->next)
    {
        hasBits = node->data.Dump(node->startIndex, hasBits);
    }
    Output::Print(_u("]\n"));
}